

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ViconCGStreamClient.cpp
# Opt level: O0

void __thiscall VViconCGStreamClient::CloseLog(VViconCGStreamClient *this)

{
  bool bVar1;
  byte bVar2;
  element_type *this_00;
  undefined1 local_20 [8];
  scoped_lock Lock;
  VViconCGStreamClient *this_local;
  
  Lock._8_8_ = this;
  boost::unique_lock<boost::mutex>::unique_lock
            ((unique_lock<boost::mutex> *)local_20,&this->m_LogMutex);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_pPostalService);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<VCGStreamPostalService,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<VCGStreamPostalService,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_pPostalService);
    VCGStreamPostalService::StopService(this_00);
  }
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) != 0) {
    std::ofstream::close();
  }
  boost::unique_lock<boost::mutex>::~unique_lock((unique_lock<boost::mutex> *)local_20);
  return;
}

Assistant:

void VViconCGStreamClient::CloseLog()
{
  boost::mutex::scoped_lock Lock(m_LogMutex);

  if( m_pPostalService )
  {
    m_pPostalService->StopService();
  }
  if( m_TimingLog.is_open() )
  {
    m_TimingLog.close();
  }
}